

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O0

void_t<typename_unique_ptr<Person>::element_type>
mserialize::detail::BuiltinDeserializer<std::unique_ptr<Person,std::default_delete<Person>>,void>::
make_nonempty<std::unique_ptr<Person,std::default_delete<Person>>>
          (unique_ptr<Person,_std::default_delete<Person>_> *ptr)

{
  unique_ptr<Person,_std::default_delete<Person>_> *this;
  pointer in_RDI;
  
  this = (unique_ptr<Person,_std::default_delete<Person>_> *)operator_new(0x28);
  *(undefined4 *)
   &(this->_M_t).super___uniq_ptr_impl<Person,_std::default_delete<Person>_>._M_t.
    super__Tuple_impl<0UL,_Person_*,_std::default_delete<Person>_>.
    super__Head_base<0UL,_Person_*,_false>._M_head_impl = 0;
  std::__cxx11::string::string((string *)(this + 1));
  std::unique_ptr<Person,_std::default_delete<Person>_>::reset(this,in_RDI);
  return;
}

Assistant:

static void_t<typename SmartPtr::element_type> make_nonempty(SmartPtr& ptr)
  {
    using T = typename SmartPtr::element_type;
    ptr.reset(new T{}); // NOLINT(cppcoreguidelines-owning-memory)
  }